

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# other-tests.cpp
# Opt level: O1

int homoMatrixDerivationTestFromFile(char *homo,char *vel,string *prefix)

{
  pointer pcVar1;
  char cVar2;
  Index IVar3;
  double dVar4;
  undefined8 uVar5;
  long lVar6;
  ostream *poVar7;
  _Elt_pointer pMVar8;
  _Elt_pointer pMVar9;
  Matrix<double,__1,__1,_0,__1,__1> *other_1;
  long lVar10;
  long lVar11;
  ulong uVar12;
  Index *pIVar13;
  double *pdVar14;
  long lVar15;
  ulong uVar16;
  long k;
  undefined1 auVar17 [16];
  IndexedMatrixArray computedVelocities;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  IndexedMatrixArray velocities;
  IndexedMatrixArray homoMatrices;
  AngleAxis aa;
  Matrix3 r2;
  Matrix3 r1;
  ofstream f2;
  ofstream f1;
  ofstream f;
  DenseStorage<double,__1,__1,__1,_0> local_9a8;
  long local_990;
  IndexedMatrixArrayT<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
  local_988;
  Matrix<double,__1,__1,_0,__1,__1> *local_928;
  double dStack_920;
  Matrix<double,__1,__1,_0,__1,__1> local_918;
  double dStack_900;
  double local_8f8;
  double dStack_8f0;
  double local_8e8;
  double dStack_8e0;
  double local_8d8;
  double dStack_8d0;
  double local_8c8;
  double dStack_8c0;
  double local_8b8;
  double dStack_8b0;
  IndexedMatrixArrayT<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
  local_8a8;
  double local_848;
  double dStack_840;
  undefined1 local_838 [24];
  double local_820;
  Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_0>
  local_818;
  IndexedMatrixArrayT<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
  local_808;
  double local_7a8;
  double dStack_7a0;
  double local_798;
  undefined8 uStack_790;
  AngleAxis<double> local_788;
  double local_768 [6];
  double local_738;
  double dStack_730;
  double local_728;
  double dStack_720;
  double local_718;
  double dStack_710;
  undefined8 local_708;
  double dStack_700;
  double local_6f8 [2];
  Matrix<double,_3,_3,_0,_3,_3> local_6e8;
  Matrix<double,_3,_3,_0,_3,_3> local_6a0;
  QuaternionBase<Eigen::Quaternion<double,_0>_> local_658 [40];
  long local_630;
  filebuf local_628 [240];
  ios_base aiStack_538 [264];
  long local_430;
  filebuf local_428 [240];
  ios_base aiStack_338 [264];
  long local_230;
  filebuf local_228 [240];
  ios_base aiStack_138 [264];
  
  local_8a8.v_.
  super__Deque_base<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  local_8a8.v_.
  super__Deque_base<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  local_8a8.v_.
  super__Deque_base<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
  ._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  local_8a8.v_.
  super__Deque_base<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  local_8a8.v_.
  super__Deque_base<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
  ._M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  local_8a8.v_.
  super__Deque_base<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
  ._M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  local_8a8.v_.
  super__Deque_base<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
  ._M_impl.super__Deque_impl_data._M_map_size = 0;
  local_8a8.v_.
  super__Deque_base<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
  ._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  local_8a8.k_ = 0;
  local_8a8.v_.
  super__Deque_base<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
  ._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  local_8a8.v_.
  super__Deque_base<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  std::
  _Deque_base<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>
  ::_M_initialize_map(&local_8a8.v_.
                       super__Deque_base<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                      ,0);
  stateObservation::
  IndexedMatrixArrayT<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>
  ::readFromFile(&local_8a8,vel,6,1,true);
  local_808.v_.
  super__Deque_base<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  local_808.v_.
  super__Deque_base<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  local_808.v_.
  super__Deque_base<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
  ._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  local_808.v_.
  super__Deque_base<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  local_808.v_.
  super__Deque_base<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
  ._M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  local_808.v_.
  super__Deque_base<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
  ._M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  local_808.v_.
  super__Deque_base<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
  ._M_impl.super__Deque_impl_data._M_map_size = 0;
  local_808.v_.
  super__Deque_base<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
  ._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  local_808.k_ = 0;
  local_808.v_.
  super__Deque_base<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
  ._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  local_808.v_.
  super__Deque_base<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  std::
  _Deque_base<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>
  ::_M_initialize_map(&local_808.v_.
                       super__Deque_base<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                      ,0);
  stateObservation::
  IndexedMatrixArrayT<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>
  ::readFromFile(&local_808,homo,4,4,true);
  local_988.v_.
  super__Deque_base<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  local_988.v_.
  super__Deque_base<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  local_988.v_.
  super__Deque_base<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
  ._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  local_988.v_.
  super__Deque_base<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  local_988.v_.
  super__Deque_base<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
  ._M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  local_988.v_.
  super__Deque_base<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
  ._M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  local_988.v_.
  super__Deque_base<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
  ._M_impl.super__Deque_impl_data._M_map_size = 0;
  local_988.v_.
  super__Deque_base<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
  ._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  local_988.k_ = 0;
  local_988.v_.
  super__Deque_base<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
  ._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  local_988.v_.
  super__Deque_base<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  std::
  _Deque_base<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>
  ::_M_initialize_map(&local_988.v_.
                       super__Deque_base<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                      ,0);
  std::ofstream::ofstream(&local_230);
  std::ofstream::ofstream(&local_430);
  std::ofstream::ofstream(&local_630);
  local_928 = &local_918;
  pcVar1 = (prefix->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_928,pcVar1,pcVar1 + prefix->_M_string_length);
  std::__cxx11::string::append((char *)&local_928);
  std::ofstream::open((char *)&local_230,(_Ios_Openmode)local_928);
  if (local_928 != &local_918) {
    operator_delete(local_928);
  }
  local_928 = &local_918;
  pcVar1 = (prefix->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_928,pcVar1,pcVar1 + prefix->_M_string_length);
  std::__cxx11::string::append((char *)&local_928);
  std::ofstream::open((char *)&local_430,(_Ios_Openmode)local_928);
  if (local_928 != &local_918) {
    operator_delete(local_928);
  }
  local_928 = &local_918;
  pcVar1 = (prefix->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_928,pcVar1,pcVar1 + prefix->_M_string_length);
  std::__cxx11::string::append((char *)&local_928);
  std::ofstream::open((char *)&local_630,(_Ios_Openmode)local_928);
  k = local_808.k_;
  if (local_928 != &local_918) {
    operator_delete(local_928);
    k = local_808.k_;
  }
  do {
    uVar5 = _memcpy;
    lVar15 = _VTT;
    lVar11 = (((long)local_808.v_.
                     super__Deque_base<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                     ._M_impl.super__Deque_impl_data._M_finish._M_node -
               (long)local_808.v_.
                     super__Deque_base<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                     ._M_impl.super__Deque_impl_data._M_start._M_node >> 3) + -1 +
             (ulong)(local_808.v_.
                     super__Deque_base<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                     ._M_impl.super__Deque_impl_data._M_finish._M_node == (_Map_pointer)0x0)) * 0x15
    ;
    lVar6 = ((long)local_808.v_.
                   super__Deque_base<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                   ._M_impl.super__Deque_impl_data._M_finish._M_cur -
             (long)local_808.v_.
                   super__Deque_base<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                   ._M_impl.super__Deque_impl_data._M_finish._M_first >> 3) * -0x5555555555555555;
    lVar10 = ((long)local_808.v_.
                    super__Deque_base<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                    ._M_impl.super__Deque_impl_data._M_start._M_last -
              (long)local_808.v_.
                    super__Deque_base<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                    ._M_impl.super__Deque_impl_data._M_start._M_cur >> 3) * -0x5555555555555555;
    if (lVar6 + local_808.k_ + lVar11 + lVar10 + -1 <= k) {
      local_630 = _VTT;
      *(undefined8 *)(local_628 + *(long *)(_VTT + -0x18) + -8) = _memcpy;
      std::filebuf::~filebuf(local_628);
      std::ios_base::~ios_base(aiStack_538);
      local_430 = lVar15;
      *(undefined8 *)(local_428 + *(long *)(lVar15 + -0x18) + -8) = uVar5;
      std::filebuf::~filebuf(local_428);
      std::ios_base::~ios_base(aiStack_338);
      local_230 = lVar15;
      *(undefined8 *)(local_228 + *(long *)(lVar15 + -0x18) + -8) = uVar5;
      std::filebuf::~filebuf(local_228);
      std::ios_base::~ios_base(aiStack_138);
      std::
      deque<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>
      ::~deque(&local_988.v_);
      std::
      deque<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>
      ::~deque(&local_808.v_);
      std::
      deque<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>
      ::~deque(&local_8a8.v_);
      return 0;
    }
    lVar10 = lVar11 + lVar6 + lVar10;
    if (((lVar10 == 0) || (k < local_808.k_)) || (lVar10 = lVar10 + local_808.k_, lVar10 <= k))
    goto LAB_00103368;
    lVar11 = ((long)local_808.v_.
                    super__Deque_base<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                    ._M_impl.super__Deque_impl_data._M_start._M_cur -
              (long)local_808.v_.
                    super__Deque_base<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                    ._M_impl.super__Deque_impl_data._M_start._M_first >> 3) * -0x5555555555555555;
    uVar12 = lVar11 + (k - local_808.k_);
    if (uVar12 < 0x15) {
      pMVar8 = local_808.v_.
               super__Deque_base<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
               ._M_impl.super__Deque_impl_data._M_start._M_cur + (k - local_808.k_);
    }
    else {
      if ((long)uVar12 < 1) {
        uVar16 = ~(~uVar12 / 0x15);
      }
      else {
        uVar16 = uVar12 / 0x15;
      }
      pMVar8 = local_808.v_.
               super__Deque_base<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
               ._M_impl.super__Deque_impl_data._M_start._M_node[uVar16] + uVar16 * -0x15 + uVar12;
    }
    if (((pMVar8->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_rows
         != 4) ||
       ((pMVar8->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_cols
        != 4)) {
LAB_001033a6:
      __assert_fail("(!(RowsAtCompileTime!=Dynamic) || (rows==RowsAtCompileTime)) && (!(ColsAtCompileTime!=Dynamic) || (cols==ColsAtCompileTime)) && (!(RowsAtCompileTime==Dynamic && MaxRowsAtCompileTime!=Dynamic) || (rows<=MaxRowsAtCompileTime)) && (!(ColsAtCompileTime==Dynamic && MaxColsAtCompileTime!=Dynamic) || (cols<=MaxColsAtCompileTime)) && rows>=0 && cols>=0 && \"Invalid sizes when resizing a matrix or array.\""
                    ,"/usr/include/eigen3/Eigen/src/Core/PlainObjectBase.h",0x115,
                    "void Eigen::PlainObjectBase<Eigen::Matrix<double, 4, 4>>::resize(Index, Index) [Derived = Eigen::Matrix<double, 4, 4>]"
                   );
    }
    pdVar14 = (pMVar8->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.
              m_data;
    local_928 = (Matrix<double,__1,__1,_0,__1,__1> *)*pdVar14;
    dStack_920 = pdVar14[1];
    local_918.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data =
         (double *)pdVar14[2];
    local_918.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows =
         (Index)pdVar14[3];
    local_918.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols =
         (Index)pdVar14[4];
    dStack_900 = pdVar14[5];
    local_8f8 = pdVar14[6];
    dStack_8f0 = pdVar14[7];
    local_8e8 = pdVar14[8];
    dStack_8e0 = pdVar14[9];
    local_8d8 = pdVar14[10];
    dStack_8d0 = pdVar14[0xb];
    local_848 = pdVar14[0xc];
    dStack_840 = pdVar14[0xd];
    local_8c8 = pdVar14[0xc];
    dStack_8c0 = pdVar14[0xd];
    local_8b8 = pdVar14[0xe];
    dStack_8b0 = pdVar14[0xf];
    lVar15 = k + 1;
    if ((lVar15 < local_808.k_) || (lVar10 <= lVar15)) goto LAB_00103368;
    uVar12 = lVar11 + (lVar15 - local_808.k_);
    if (uVar12 < 0x15) {
      pMVar8 = local_808.v_.
               super__Deque_base<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
               ._M_impl.super__Deque_impl_data._M_start._M_cur + (lVar15 - local_808.k_);
    }
    else {
      if ((long)uVar12 < 1) {
        uVar16 = ~(~uVar12 / 0x15);
      }
      else {
        uVar16 = uVar12 / 0x15;
      }
      pMVar8 = local_808.v_.
               super__Deque_base<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
               ._M_impl.super__Deque_impl_data._M_start._M_node[uVar16] + uVar16 * -0x15 + uVar12;
    }
    local_990 = lVar15;
    if (((pMVar8->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_rows
         != 4) ||
       ((pMVar8->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_cols
        != 4)) goto LAB_001033a6;
    pdVar14 = (pMVar8->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.
              m_data;
    local_768[0] = *pdVar14;
    local_768[1] = pdVar14[1];
    local_768[2] = pdVar14[2];
    local_768[3] = pdVar14[3];
    local_768[4] = pdVar14[4];
    local_768[5] = pdVar14[5];
    local_738 = pdVar14[6];
    dStack_730 = pdVar14[7];
    local_728 = pdVar14[8];
    dStack_720 = pdVar14[9];
    local_718 = pdVar14[10];
    dStack_710 = pdVar14[0xb];
    local_838._0_16_ = *(undefined1 (*) [16])(pdVar14 + 0xc);
    local_708 = *(undefined8 *)*(undefined1 (*) [16])(pdVar14 + 0xc);
    dStack_700 = pdVar14[0xd];
    local_6f8[0] = pdVar14[0xe];
    local_6f8[1] = pdVar14[0xf];
    lVar11 = 0x10;
    pIVar13 = (Index *)&local_918;
    do {
      IVar3 = pIVar13[-1];
      *(Index *)((long)local_6e8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                       m_storage.m_data.array + lVar11 + 0x38) = pIVar13[-2];
      *(Index *)((long)local_6e8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                       m_storage.m_data.array + lVar11 + 0x40) = IVar3;
      *(Index *)((long)local_6a0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                       m_storage.m_data.array + lVar11) = *pIVar13;
      lVar11 = lVar11 + 0x18;
      pIVar13 = pIVar13 + 4;
    } while (lVar11 != 0x58);
    lVar11 = 0x10;
    pdVar14 = local_768 + 2;
    do {
      dVar4 = pdVar14[-1];
      *(double *)((long)local_6f8 + lVar11) = pdVar14[-2];
      *(double *)
       ((long)local_6e8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
              m_data.array + lVar11 + -8) = dVar4;
      *(double *)
       ((long)local_6e8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
              m_data.array + lVar11) = *pdVar14;
      lVar11 = lVar11 + 0x18;
      pdVar14 = pdVar14 + 4;
    } while (lVar11 != 0x58);
    local_818.m_lhs = &local_6e8;
    local_818.m_rhs.m_matrix = &local_6a0;
    Eigen::internal::
    quaternionbase_assign_impl<Eigen::Product<Eigen::Matrix<double,3,3,0,3,3>,Eigen::Transpose<Eigen::Matrix<double,3,3,0,3,3>>,0>,3,3>
    ::run<Eigen::Quaternion<double,0>>(local_658,&local_818);
    Eigen::AngleAxis<double>::operator=(&local_788,local_658);
    local_798 = local_788.m_angle / 0.005;
    uStack_790 = 0;
    local_820 = local_788.m_axis.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                m_storage.m_data.array[0] * local_798;
    local_7a8 = local_788.m_axis.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                m_storage.m_data.array[1];
    dStack_7a0 = local_788.m_axis.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                 m_storage.m_data.array[2];
    auVar17._0_8_ = (double)local_838._0_8_ - local_848;
    auVar17._8_8_ = (double)local_838._8_8_ - dStack_840;
    local_838._0_16_ = divpd(auVar17,_DAT_0010b050);
    local_848 = local_6f8[0] - local_8b8;
    local_9a8.m_data = (double *)0x0;
    local_9a8.m_rows = 0;
    local_9a8.m_cols = 0;
    Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::resize(&local_9a8,6,6,1);
    if ((local_9a8.m_rows != 6) || (local_9a8.m_cols != 1)) {
      Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::resize(&local_9a8,6,6,1);
    }
    if ((local_9a8.m_rows != 6) || (local_9a8.m_cols != 1)) {
      __assert_fail("dst.rows() == dstRows && dst.cols() == dstCols",
                    "/usr/include/eigen3/Eigen/src/Core/AssignEvaluator.h",0x2fd,
                    "void Eigen::internal::resize_if_allowed(DstXprType &, const SrcXprType &, const internal::assign_op<T1, T2> &) [DstXprType = Eigen::Matrix<double, -1, -1>, SrcXprType = Eigen::Matrix<double, 6, 1>, T1 = double, T2 = double]"
                   );
    }
    *local_9a8.m_data = (double)local_838._0_8_;
    local_9a8.m_data[1] = (double)local_838._8_8_;
    local_9a8.m_data[2] = local_848 / 0.005;
    local_9a8.m_data[3] = local_820;
    local_9a8.m_data[4] = local_798 * local_7a8;
    local_9a8.m_data[5] = local_798 * dStack_7a0;
    stateObservation::
    IndexedMatrixArrayT<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>
    ::setValue(&local_988,(Matrix<double,__1,__1,_0,__1,__1> *)&local_9a8,k);
    free(local_9a8.m_data);
    poVar7 = std::ostream::_M_insert<long>((long)&local_230);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7," \t ",3);
    lVar11 = 0;
    while( true ) {
      lVar15 = ((long)local_988.v_.
                      super__Deque_base<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                      ._M_impl.super__Deque_impl_data._M_start._M_last -
                (long)local_988.v_.
                      super__Deque_base<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                      ._M_impl.super__Deque_impl_data._M_start._M_cur >> 3) * -0x5555555555555555 +
               ((long)local_988.v_.
                      super__Deque_base<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                      ._M_impl.super__Deque_impl_data._M_finish._M_cur -
                (long)local_988.v_.
                      super__Deque_base<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                      ._M_impl.super__Deque_impl_data._M_finish._M_first >> 3) * -0x5555555555555555
               + (((long)local_988.v_.
                         super__Deque_base<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                         ._M_impl.super__Deque_impl_data._M_finish._M_node -
                   (long)local_988.v_.
                         super__Deque_base<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                         ._M_impl.super__Deque_impl_data._M_start._M_node >> 3) + -1 +
                 (ulong)(local_988.v_.
                         super__Deque_base<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                         ._M_impl.super__Deque_impl_data._M_finish._M_node == (_Map_pointer)0x0)) *
                 0x15;
      if (((lVar15 == 0) || (k < local_988.k_)) || (local_988.k_ + lVar15 <= k)) goto LAB_00103368;
      uVar12 = ((long)local_988.v_.
                      super__Deque_base<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                      ._M_impl.super__Deque_impl_data._M_start._M_cur -
                (long)local_988.v_.
                      super__Deque_base<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                      ._M_impl.super__Deque_impl_data._M_start._M_first >> 3) * -0x5555555555555555
               + (k - local_988.k_);
      if (uVar12 < 0x15) {
        pMVar8 = local_988.v_.
                 super__Deque_base<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                 ._M_impl.super__Deque_impl_data._M_start._M_cur + (k - local_988.k_);
      }
      else {
        if ((long)uVar12 < 1) {
          uVar16 = ~(~uVar12 / 0x15);
        }
        else {
          uVar16 = uVar12 / 0x15;
        }
        pMVar8 = local_988.v_.
                 super__Deque_base<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                 ._M_impl.super__Deque_impl_data._M_start._M_node[uVar16] + uVar16 * -0x15 + uVar12;
      }
      if ((pMVar8->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.
          m_rows <= lVar11) break;
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230," ",1);
      lVar15 = ((long)local_988.v_.
                      super__Deque_base<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                      ._M_impl.super__Deque_impl_data._M_start._M_last -
                (long)local_988.v_.
                      super__Deque_base<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                      ._M_impl.super__Deque_impl_data._M_start._M_cur >> 3) * -0x5555555555555555 +
               ((long)local_988.v_.
                      super__Deque_base<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                      ._M_impl.super__Deque_impl_data._M_finish._M_cur -
                (long)local_988.v_.
                      super__Deque_base<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                      ._M_impl.super__Deque_impl_data._M_finish._M_first >> 3) * -0x5555555555555555
               + (((long)local_988.v_.
                         super__Deque_base<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                         ._M_impl.super__Deque_impl_data._M_finish._M_node -
                   (long)local_988.v_.
                         super__Deque_base<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                         ._M_impl.super__Deque_impl_data._M_start._M_node >> 3) + -1 +
                 (ulong)(local_988.v_.
                         super__Deque_base<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                         ._M_impl.super__Deque_impl_data._M_finish._M_node == (_Map_pointer)0x0)) *
                 0x15;
      if (((lVar15 == 0) || (k < local_988.k_)) || (local_988.k_ + lVar15 <= k)) goto LAB_00103368;
      uVar12 = ((long)local_988.v_.
                      super__Deque_base<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                      ._M_impl.super__Deque_impl_data._M_start._M_cur -
                (long)local_988.v_.
                      super__Deque_base<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                      ._M_impl.super__Deque_impl_data._M_start._M_first >> 3) * -0x5555555555555555
               + (k - local_988.k_);
      if (uVar12 < 0x15) {
        pMVar8 = local_988.v_.
                 super__Deque_base<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                 ._M_impl.super__Deque_impl_data._M_start._M_cur + (k - local_988.k_);
      }
      else {
        if ((long)uVar12 < 1) {
          uVar16 = ~(~uVar12 / 0x15);
        }
        else {
          uVar16 = uVar12 / 0x15;
        }
        pMVar8 = local_988.v_.
                 super__Deque_base<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                 ._M_impl.super__Deque_impl_data._M_start._M_node[uVar16] + uVar16 * -0x15 + uVar12;
      }
      lVar15 = (pMVar8->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.
               m_cols * (pMVar8->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
                        m_storage.m_rows;
      if (lVar15 - lVar11 == 0 || lVar15 < lVar11) {
LAB_00103387:
        __assert_fail("index >= 0 && index < size()",
                      "/usr/include/eigen3/Eigen/src/Core/DenseCoeffsBase.h",0x1ab,
                      "Scalar &Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, -1>, 1>::operator()(Index) [Derived = Eigen::Matrix<double, -1, -1>, Level = 1]"
                     );
      }
      lVar15 = ((long)local_8a8.v_.
                      super__Deque_base<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                      ._M_impl.super__Deque_impl_data._M_start._M_last -
                (long)local_8a8.v_.
                      super__Deque_base<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                      ._M_impl.super__Deque_impl_data._M_start._M_cur >> 3) * -0x5555555555555555 +
               ((long)local_8a8.v_.
                      super__Deque_base<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                      ._M_impl.super__Deque_impl_data._M_finish._M_cur -
                (long)local_8a8.v_.
                      super__Deque_base<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                      ._M_impl.super__Deque_impl_data._M_finish._M_first >> 3) * -0x5555555555555555
               + (((long)local_8a8.v_.
                         super__Deque_base<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                         ._M_impl.super__Deque_impl_data._M_finish._M_node -
                   (long)local_8a8.v_.
                         super__Deque_base<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                         ._M_impl.super__Deque_impl_data._M_start._M_node >> 3) + -1 +
                 (ulong)(local_8a8.v_.
                         super__Deque_base<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                         ._M_impl.super__Deque_impl_data._M_finish._M_node == (_Map_pointer)0x0)) *
                 0x15;
      if (((lVar15 == 0) || (k < local_8a8.k_)) || (local_8a8.k_ + lVar15 <= k)) goto LAB_00103368;
      uVar12 = ((long)local_8a8.v_.
                      super__Deque_base<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                      ._M_impl.super__Deque_impl_data._M_start._M_cur -
                (long)local_8a8.v_.
                      super__Deque_base<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                      ._M_impl.super__Deque_impl_data._M_start._M_first >> 3) * -0x5555555555555555
               + (k - local_8a8.k_);
      if (uVar12 < 0x15) {
        pMVar9 = local_8a8.v_.
                 super__Deque_base<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                 ._M_impl.super__Deque_impl_data._M_start._M_cur + (k - local_8a8.k_);
      }
      else {
        if ((long)uVar12 < 1) {
          uVar16 = ~(~uVar12 / 0x15);
        }
        else {
          uVar16 = uVar12 / 0x15;
        }
        pMVar9 = local_8a8.v_.
                 super__Deque_base<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                 ._M_impl.super__Deque_impl_data._M_start._M_node[uVar16] + uVar16 * -0x15 + uVar12;
      }
      lVar15 = (pMVar9->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.
               m_cols * (pMVar9->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
                        m_storage.m_rows;
      if (lVar15 - lVar11 == 0 || lVar15 < lVar11) goto LAB_00103387;
      std::ostream::_M_insert<double>
                ((pMVar8->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
                 m_storage.m_data[lVar11] -
                 (pMVar9->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
                 m_storage.m_data[lVar11]);
      lVar11 = lVar11 + 1;
    }
    cVar2 = (char)(ostream *)&local_230;
    std::ios::widen((char)*(undefined8 *)(local_230 + -0x18) + cVar2);
    std::ostream::put(cVar2);
    std::ostream::flush();
    poVar7 = std::ostream::_M_insert<long>((long)&local_430);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7," \t ",3);
    lVar11 = ((long)local_988.v_.
                    super__Deque_base<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                    ._M_impl.super__Deque_impl_data._M_start._M_last -
              (long)local_988.v_.
                    super__Deque_base<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                    ._M_impl.super__Deque_impl_data._M_start._M_cur >> 3) * -0x5555555555555555 +
             ((long)local_988.v_.
                    super__Deque_base<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                    ._M_impl.super__Deque_impl_data._M_finish._M_cur -
              (long)local_988.v_.
                    super__Deque_base<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                    ._M_impl.super__Deque_impl_data._M_finish._M_first >> 3) * -0x5555555555555555 +
             (((long)local_988.v_.
                     super__Deque_base<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                     ._M_impl.super__Deque_impl_data._M_finish._M_node -
               (long)local_988.v_.
                     super__Deque_base<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                     ._M_impl.super__Deque_impl_data._M_start._M_node >> 3) + -1 +
             (ulong)(local_988.v_.
                     super__Deque_base<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                     ._M_impl.super__Deque_impl_data._M_finish._M_node == (_Map_pointer)0x0)) * 0x15
    ;
    if (((lVar11 == 0) || (k < local_988.k_)) || (local_988.k_ + lVar11 <= k)) {
LAB_00103368:
      __assert_fail("checkIndex(time) && \"Error: Time out of range\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/mehdi-benallegue[P]state-observation/include/state-observation/tools/definitions.hxx"
                    ,0x192,
                    "void stateObservation::IndexedMatrixArrayT<>::check_(TimeIndex) const [MatrixType = Eigen::Matrix<double, -1, -1>, Allocator = std::allocator<Eigen::Matrix<double, -1, -1>>]"
                   );
    }
    uVar12 = ((long)local_988.v_.
                    super__Deque_base<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                    ._M_impl.super__Deque_impl_data._M_start._M_cur -
              (long)local_988.v_.
                    super__Deque_base<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                    ._M_impl.super__Deque_impl_data._M_start._M_first >> 3) * -0x5555555555555555 +
             (k - local_988.k_);
    if (uVar12 < 0x15) {
      local_928 = local_988.v_.
                  super__Deque_base<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                  ._M_impl.super__Deque_impl_data._M_start._M_cur + (k - local_988.k_);
    }
    else {
      if ((long)uVar12 < 1) {
        uVar16 = ~(~uVar12 / 0x15);
      }
      else {
        uVar16 = uVar12 / 0x15;
      }
      local_928 = local_988.v_.
                  super__Deque_base<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                  ._M_impl.super__Deque_impl_data._M_start._M_node[uVar16] + uVar16 * -0x15 + uVar12
      ;
    }
    poVar7 = Eigen::operator<<(poVar7,(DenseBase<Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                                       *)&local_928);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
    std::ostream::put((char)poVar7);
    std::ostream::flush();
    poVar7 = std::ostream::_M_insert<long>((long)&local_630);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7," \t ",3);
    lVar11 = local_990;
    lVar15 = ((long)local_8a8.v_.
                    super__Deque_base<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                    ._M_impl.super__Deque_impl_data._M_start._M_last -
              (long)local_8a8.v_.
                    super__Deque_base<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                    ._M_impl.super__Deque_impl_data._M_start._M_cur >> 3) * -0x5555555555555555 +
             ((long)local_8a8.v_.
                    super__Deque_base<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                    ._M_impl.super__Deque_impl_data._M_finish._M_cur -
              (long)local_8a8.v_.
                    super__Deque_base<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                    ._M_impl.super__Deque_impl_data._M_finish._M_first >> 3) * -0x5555555555555555 +
             (((long)local_8a8.v_.
                     super__Deque_base<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                     ._M_impl.super__Deque_impl_data._M_finish._M_node -
               (long)local_8a8.v_.
                     super__Deque_base<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                     ._M_impl.super__Deque_impl_data._M_start._M_node >> 3) + -1 +
             (ulong)(local_8a8.v_.
                     super__Deque_base<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                     ._M_impl.super__Deque_impl_data._M_finish._M_node == (_Map_pointer)0x0)) * 0x15
    ;
    if (((lVar15 == 0) || (k < local_8a8.k_)) || (local_8a8.k_ + lVar15 <= k)) goto LAB_00103368;
    uVar12 = ((long)local_8a8.v_.
                    super__Deque_base<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                    ._M_impl.super__Deque_impl_data._M_start._M_cur -
              (long)local_8a8.v_.
                    super__Deque_base<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                    ._M_impl.super__Deque_impl_data._M_start._M_first >> 3) * -0x5555555555555555 +
             (k - local_8a8.k_);
    if (uVar12 < 0x15) {
      local_928 = local_8a8.v_.
                  super__Deque_base<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                  ._M_impl.super__Deque_impl_data._M_start._M_cur + (k - local_8a8.k_);
    }
    else {
      if ((long)uVar12 < 1) {
        uVar16 = ~(~uVar12 / 0x15);
      }
      else {
        uVar16 = uVar12 / 0x15;
      }
      local_928 = local_8a8.v_.
                  super__Deque_base<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                  ._M_impl.super__Deque_impl_data._M_start._M_node[uVar16] + uVar16 * -0x15 + uVar12
      ;
    }
    poVar7 = Eigen::operator<<(poVar7,(DenseBase<Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                                       *)&local_928);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
    std::ostream::put((char)poVar7);
    std::ostream::flush();
    k = lVar11;
  } while( true );
}

Assistant:

int homoMatrixDerivationTestFromFile(char * homo, char * vel, const std::string & prefix)
{
  IndexedMatrixArray velocities;
  velocities.readFromFile(vel, 6);
  IndexedMatrixArray homoMatrices;
  homoMatrices.readFromFile(homo, 4, 4);

  IndexedMatrixArray computedVelocities;

  std::ofstream f, f1, f2;
  f.open((prefix + "output.dat").c_str());
  f1.open((prefix + "computed.dat").c_str());
  f2.open((prefix + "real.dat").c_str());

  for(TimeIndex i = homoMatrices.getFirstIndex(); i < homoMatrices.getLastIndex(); ++i)
  {
    computedVelocities.setValue(kine::derivateHomogeneousMatrixFD(homoMatrices[i], homoMatrices[i + 1], dt), i);

    f << i << " \t ";
    for(long j = 0; j < computedVelocities[i].rows(); ++j)
    {
      f << " " << computedVelocities[i](j) - velocities[i](j);
    }

    f << std::endl;

    f1 << i << " \t " << computedVelocities[i].transpose() << std::endl;
    f2 << i << " \t " << velocities[i].transpose() << std::endl;
  }

  return 0;
}